

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1352d2::SharedLibraryShellCommand::configureAttribute
          (SharedLibraryShellCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  int iVar1;
  string *this_00;
  char *pcVar2;
  short *__s1;
  size_t sVar3;
  StringRef Separator;
  size_t sStack_280;
  StringRef value_local;
  Child local_268;
  size_t sStack_260;
  undefined8 local_258;
  Twine local_250;
  SmallVector<llvm::StringRef,_32U> args;
  
  sVar3 = value.Length;
  __s1 = (short *)value.Data;
  pcVar2 = name.Data;
  value_local.Data = (char *)__s1;
  value_local.Length = sVar3;
  if (name.Length != 0xe) {
    if (name.Length != 10) {
      return true;
    }
    iVar1 = bcmp(pcVar2,"executable",10);
    if (iVar1 != 0) {
      iVar1 = bcmp(pcVar2,"other-args",10);
      if (iVar1 != 0) {
        return true;
      }
      args.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
           &args.super_SmallVectorStorage<llvm::StringRef,_32U>;
      args.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
      args.super_SmallVectorImpl<llvm::StringRef>.
      super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 0x20;
      local_268.cString = value_local.Data;
      sStack_260 = value_local.Length;
      Separator.Length = 1;
      Separator.Data = " ";
      llvm::StringRef::split
                ((StringRef *)&local_268,&args.super_SmallVectorImpl<llvm::StringRef>,Separator,-1,
                 false);
      local_268.twine = (Twine *)0x0;
      sStack_260 = 0;
      local_258 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<llvm::StringRef*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                 args.super_SmallVectorImpl<llvm::StringRef>.
                 super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX
                 ,(void *)((args.super_SmallVectorImpl<llvm::StringRef>.
                            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase._8_8_ & 0xffffffff) * 0x10 +
                          (long)args.super_SmallVectorImpl<llvm::StringRef>.
                                super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&this->otherArgs,&local_268);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_268);
      llvm::SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                (&args.super_SmallVectorImpl<llvm::StringRef>);
      return true;
    }
    llvm::StringRef::str_abi_cxx11_((string *)&args,&value_local);
    this_00 = (string *)&this->executable;
    goto LAB_0014c9bd;
  }
  iVar1 = bcmp(pcVar2,"compiler-style",0xe);
  if (iVar1 != 0) {
    return true;
  }
  if (sVar3 == 6) {
    pcVar2 = "swiftc";
    sStack_280 = 6;
LAB_0014c950:
    iVar1 = bcmp(__s1,pcVar2,sStack_280);
    if (iVar1 != 0) {
LAB_0014c95d:
      llvm::Twine::Twine((Twine *)&local_268,"Unsupported : compiler-style\'",&value_local);
      llvm::Twine::Twine(&local_250,
                         "\' for shared libraries\'.  Supported styles are cl, clang, and swiftc");
      llvm::Twine::concat((Twine *)&args,(Twine *)&local_268,&local_250);
      llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&args);
    }
  }
  else {
    if (sVar3 == 5) {
      pcVar2 = "clang";
      sStack_280 = 5;
      goto LAB_0014c950;
    }
    if ((sVar3 != 2) || (*__s1 != 0x6c63)) goto LAB_0014c95d;
  }
  llvm::StringRef::str_abi_cxx11_((string *)&args,&value_local);
  this_00 = (string *)&this->compilerStyle;
LAB_0014c9bd:
  std::__cxx11::string::operator=(this_00,(string *)&args);
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "executable") {
      executable = value;
    } else if (name == "other-args") {
      SmallVector<StringRef, 32> args;
      StringRef(value).split(args, " ", /*MaxSplit=*/-1,
                             /*KeepEmpty=*/false);
      otherArgs = std::vector<std::string>(args.begin(), args.end());
    } else if (name == "compiler-style") {
      if (value != "cl" && value != "clang" && value != "swiftc") {
        ctx.error("Unsupported : compiler-style'" + value +
                  "' for shared libraries'.  Supported styles are cl, clang, "
                  "and swiftc");
      }
      compilerStyle = value;
    }
    return true;
  }